

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O3

void compute_vels(float (*Ix) [512],float (*Iy) [512],float (*It) [512],float (*full_vels) [512] [2]
                 ,float (*norm_vels1) [512] [2],float (*norm_vels2) [512] [2],int pic_x,int pic_y,
                 int n,float tau_D,int flag,float (*E) [512])

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  long lVar6;
  float (*pafVar7) [5];
  long lVar8;
  long lVar9;
  float (*paafVar10) [512] [2];
  float (*paafVar11) [512] [2];
  long lVar12;
  float (*paafVar13) [512] [2];
  float (*pafVar14) [512];
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float afVar24 [2];
  undefined1 auVar25 [16];
  float fVar26;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  ulong local_1a8;
  float eigenvalues [2];
  int nrot;
  float (*local_170) [512] [2];
  float (*local_168) [512];
  float (*local_160) [512];
  float (*local_158) [512] [2];
  float (*local_150) [512];
  float (*local_148) [512];
  long local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  float angle;
  float length2;
  float length1;
  float local_d8 [8];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float diff2 [2];
  float diff1 [2];
  float weight [5] [5];
  
  local_168 = E;
  local_170 = norm_vels1;
  local_160 = It;
  local_158 = norm_vels2;
  local_150 = Ix;
  local_148 = Iy;
  printf("Eigenvalue Threshold: %f\n",SUB84((double)tau_D,0));
  printf("Threshold on Raw Normal Velocities: %f\n",SUB84((double)RAW_MAG,0));
  MAX_RAW_MAG = -INFINITY;
  fflush(_stdout);
  local_d8[4] = 0.0625;
  local_d8[0] = 0.0625;
  local_d8[1] = 0.25;
  local_d8[2] = 0.375;
  local_d8[3] = 0.25;
  puts("Coefficients");
  fVar20 = 0.0;
  pafVar7 = weight;
  lVar18 = 0;
  do {
    fVar26 = local_d8[lVar18];
    lVar16 = 0;
    do {
      fVar19 = local_d8[lVar16] * fVar26;
      (*pafVar7)[lVar16] = fVar19;
      printf("%12.8f \n",SUB84((double)fVar19,0));
      fVar20 = fVar20 + fVar19;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 5);
    putchar(10);
    lVar18 = lVar18 + 1;
    pafVar7 = pafVar7 + 1;
  } while (lVar18 != 5);
  printf("Sum=%f\n",SUB84((double)fVar20,0));
  lVar18 = 0;
  lVar16 = 0;
  paafVar10 = full_vels;
  paafVar11 = local_170;
  paafVar13 = local_158;
  pafVar14 = local_168;
  do {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)(*paafVar10)[0] + lVar8 * 2) = 0x42c8000042c80000;
      *(undefined8 *)((long)(*paafVar11)[0] + lVar8 * 2) = 0x42c8000042c80000;
      *(undefined8 *)((long)(*paafVar13)[0] + lVar8 * 2) = 0x42c8000042c80000;
      *(undefined4 *)((long)*pafVar14 + lVar8) = 0;
      *(undefined4 *)((long)Imag[0] + lVar18 + lVar8) = 0;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x800);
    lVar16 = lVar16 + 1;
    pafVar14 = pafVar14 + 1;
    paafVar13 = paafVar13 + 1;
    paafVar11 = paafVar11 + 1;
    paafVar10 = paafVar10 + 1;
    lVar18 = lVar18 + 0x800;
  } while (lVar16 != 0x200);
  local_1c0 = 0;
  local_1c4 = 0;
  local_1b4 = 0;
  local_1bc = 0;
  local_1b8 = 0;
  local_1a8 = 0;
  if (n < pic_x - n) {
    lVar8 = (long)n;
    lVar16 = lVar8 * 0x804;
    lVar17 = (long)local_150 + lVar16 + -0x1008;
    lVar18 = (long)local_148 + lVar16 + -0x1008;
    lVar16 = (long)local_160 + lVar16 + -0x1008;
    local_1a8 = 0;
    local_1b8 = 0;
    local_1bc = 0;
    local_1b4 = 0;
    local_1c4 = 0;
    local_1c0 = 0;
    local_108 = lVar8;
    do {
      lVar15 = local_108;
      local_100 = lVar16;
      local_f8 = lVar18;
      local_f0 = lVar17;
      if (n < pic_y - n) {
        do {
          local_140 = lVar8;
          fStack_10c = 0.0;
          local_118 = 0.0;
          fStack_120 = 0.0;
          fStack_11c = 0.0;
          fVar26 = 0.0;
          lVar5 = -2;
          pafVar7 = weight;
          fVar20 = 1.0;
          fStack_114 = 0.0;
          fStack_b4 = 0.0;
          fStack_b0 = 0.0;
          fStack_ac = 0.0;
          lVar8 = lVar16;
          lVar6 = lVar18;
          lVar9 = lVar17;
          do {
            lVar12 = 0;
            do {
              if (flag == 1) {
                fVar20 = *(float *)(lVar9 + lVar12 * 4);
                fVar19 = *(float *)(lVar6 + lVar12 * 4);
                fVar20 = (fVar20 * fVar20 + fVar19 * fVar19) * 0.08 + 1.0;
              }
              fVar19 = (*pafVar7)[lVar12];
              fVar23 = *(float *)(lVar6 + lVar12 * 4);
              fVar1 = *(float *)(lVar9 + lVar12 * 4);
              fVar2 = *(float *)(lVar8 + lVar12 * 4);
              auVar21._0_4_ = fVar23 * fVar23 * fVar19;
              auVar21._4_4_ = fVar1 * fVar1 * fVar19;
              auVar21._8_4_ = fVar19 * 0.0;
              auVar21._12_4_ = fVar19 * 0.0;
              auVar22._4_4_ = fVar20;
              auVar22._0_4_ = fVar20;
              auVar22._8_4_ = fVar20;
              auVar22._12_4_ = fVar20;
              auVar22 = divps(auVar21,auVar22);
              fStack_10c = fStack_10c + auVar22._0_4_;
              local_118 = local_118 + auVar22._4_4_;
              fStack_120 = fStack_120 + auVar22._8_4_;
              fStack_11c = fStack_11c + auVar22._12_4_;
              auVar25._0_4_ = fVar23 * fVar1 * fVar19;
              auVar25._4_4_ = fVar2 * fVar1 * fVar19;
              auVar25._8_4_ = fVar1 * 0.0 * fVar19;
              auVar25._12_4_ = fVar1 * 0.0 * fVar19;
              auVar3._4_4_ = fVar20;
              auVar3._0_4_ = fVar20;
              auVar3._8_4_ = fVar20;
              auVar3._12_4_ = fVar20;
              auVar22 = divps(auVar25,auVar3);
              fStack_114 = fStack_114 + auVar22._0_4_;
              fStack_b4 = fStack_b4 + auVar22._4_4_;
              fStack_b0 = fStack_b0 + auVar22._8_4_;
              fStack_ac = fStack_ac + auVar22._12_4_;
              fVar26 = fVar26 + (fVar23 * fVar2 * fVar19) / fVar20;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 5);
            lVar5 = lVar5 + 1;
            pafVar7 = pafVar7 + 1;
            lVar9 = lVar9 + 0x800;
            lVar6 = lVar6 + 0x800;
            lVar8 = lVar8 + 0x800;
          } while (lVar5 != 3);
          if (flag == 1) {
            fStack_10c = fStack_10c + 0.5;
            local_118 = local_118 + 0.5;
            fStack_120 = fStack_120 + 0.0;
            fStack_11c = fStack_11c + 0.0;
          }
          local_128 = fStack_10c;
          fStack_124 = local_118;
          fStack_110 = fStack_114;
          local_b8 = fStack_114;
          jacobi((float (*) [2])&local_118,2,eigenvalues,(float (*) [2])&local_138,&nrot);
          iVar4 = check_eigen_calc((float (*) [2])&local_118,eigenvalues,(float (*) [2])&local_138,
                                   nrot,diff1,diff2,&length1,&length2,&angle);
          fVar23 = fStack_130;
          fVar19 = local_138;
          fVar20 = eigenvalues[0];
          if (iVar4 == 0) {
            local_1b8 = local_1b8 + 1;
          }
          else {
            if (eigenvalues[0] < eigenvalues[1]) {
              eigenvalues[0] = eigenvalues[1];
              eigenvalues[1] = fVar20;
              local_138 = fStack_134;
              fStack_134 = fVar19;
              fStack_130 = fStack_12c;
              fStack_12c = fVar23;
            }
            fVar19 = fStack_124 * local_128 - local_b8 * local_b8;
            fVar20 = -local_b8 / fVar19;
            if ((eigenvalues[0] < tau_D) || (eigenvalues[1] < tau_D)) {
              if ((eigenvalues[0] <= tau_D) || (ABS(fVar19) <= 1e-08)) {
                local_1bc = local_1bc + 1;
              }
              else {
                fVar20 = (float)((uint)((local_128 / fVar19) * fStack_b4 + fVar26 * fVar20) ^
                                (uint)DAT_00106080) * local_138 -
                         (fStack_b4 * fVar20 + (fStack_124 / fVar19) * fVar26) * fStack_130;
                afVar24[0] = fVar20 * fStack_130;
                afVar24[1] = (float)((uint)fVar20 ^ (uint)DAT_00106080) * local_138;
                local_170[local_140][lVar15] = afVar24;
                local_1c4 = local_1c4 + 1;
              }
            }
            else if (fVar19 <= 0.0) {
              full_vels[local_140][lVar15] = (float  [2])0x42c8000042c80000;
            }
            else {
              fVar23 = (local_128 / fVar19) * fStack_b4 + fVar26 * fVar20;
              full_vels[local_140][lVar15][1] = fVar23;
              fVar26 = -(fStack_b4 * fVar20 + (fStack_124 / fVar19) * fVar26);
              full_vels[local_140][lVar15][0] = fVar26;
              fVar20 = local_168[local_140][lVar15];
              lVar5 = -2;
              pafVar7 = weight;
              lVar8 = lVar16;
              lVar6 = lVar18;
              lVar9 = lVar17;
              do {
                lVar12 = 0;
                do {
                  fVar19 = (*(float *)(lVar9 + lVar12 * 4) * -fVar23 +
                            *(float *)(lVar6 + lVar12 * 4) * fVar26 + *(float *)(lVar8 + lVar12 * 4)
                           ) * (*pafVar7)[lVar12];
                  fVar20 = fVar20 + fVar19 * fVar19;
                  local_168[local_140][lVar15] = fVar20;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 5);
                lVar5 = lVar5 + 1;
                lVar9 = lVar9 + 0x800;
                lVar6 = lVar6 + 0x800;
                lVar8 = lVar8 + 0x800;
                pafVar7 = pafVar7 + 1;
              } while (lVar5 != 3);
              local_1c0 = local_1c0 + 1;
            }
          }
          fVar20 = local_150[local_140][lVar15] * local_150[local_140][lVar15] +
                   local_148[local_140][lVar15] * local_148[local_140][lVar15];
          fVar26 = SQRT(fVar20);
          Imag[local_140][lVar15] = fVar26;
          if (MAX_RAW_MAG < fVar26) {
            MAX_RAW_MAG = fVar26;
          }
          if (fVar26 <= RAW_MAG) {
            local_1a8 = (ulong)((int)local_1a8 + 1);
          }
          else {
            local_158[local_140][lVar15][1] =
                 (local_160[local_140][lVar15] * local_150[local_140][lVar15]) / fVar20;
            local_158[local_140][lVar15][0] =
                 (-local_160[local_140][lVar15] * local_148[local_140][lVar15]) / fVar20;
            local_1b4 = local_1b4 + 1;
          }
          lVar15 = lVar15 + 1;
          lVar17 = lVar17 + 4;
          lVar18 = lVar18 + 4;
          lVar16 = lVar16 + 4;
          lVar8 = local_140;
        } while (pic_y - n != (int)lVar15);
      }
      lVar8 = lVar8 + 1;
      lVar17 = local_f0 + 0x800;
      lVar18 = local_f8 + 0x800;
      lVar16 = local_100 + 0x800;
    } while (pic_x - n != (int)lVar8);
  }
  printf("%d full velocities computed\n",(ulong)local_1c0);
  printf("%d least squares normal velocities computed\n",(ulong)local_1c4);
  printf("%d raw normal velocities computed\n",(ulong)local_1b4);
  printf("%d locations where velocity information thresholded\n",(ulong)local_1bc);
  printf("%d locations where eigenvalue/eigenvector calculation failed\n",(ulong)local_1b8);
  printf("%d locations with spatial gradient is zero\n",local_1a8);
  fflush(_stdout);
  return;
}

Assistant:

void compute_vels(
float Ix[PIC_X][PIC_Y],
float Iy[PIC_X][PIC_Y],
float It[PIC_X][PIC_Y],
float full_vels[PIC_X][PIC_Y][2],
float norm_vels1[PIC_X][PIC_Y][2],
float norm_vels2[PIC_X][PIC_Y][2],
int pic_x, int pic_y, int n,
float tau_D,
int flag, float E[PIC_X][PIC_Y])
{
float mag,M[2][2],MI[2][2],B[2],denominator;
float eigenvalues[2],eigenvectors[2][2],length1,length2;
float angle,temp1,v1,v2;
float sigma1,sigma2,sigmap,temp,diff1[N],diff2[N];
int i,j,k,l,full_count,norm_count1,norm_count2,no_count,nrot,eigen_count,no_swaps;
float eigenvalues2[2],eigenvectors2[2][2],weight[5][5],sum,coeff[5],v[2];
int mag_zero;
int kk;


printf("Eigenvalue Threshold: %f\n",tau_D);
printf("Threshold on Raw Normal Velocities: %f\n",RAW_MAG);
MAX_RAW_MAG = (float) -HUGE_VAL;
mag_zero = 0;
fflush(stdout);
/* Parameter values as specified in Simoncelli, Adelson and Heeger, page 313  */
sigma1 = 0.08f;
sigma2 = 1.0f;
sigmap = 2.0f;

/* Compute weights */
sum = 0.0;
coeff[0] = coeff[4] = 0.0625;
coeff[1] = coeff[3] = 0.25;
coeff[2] = 0.375;
printf("Coefficients\n");
for(i=0;i<5;i++)
{
for(j=0;j<5;j++)
	{
	weight[i][j] = coeff[i]*coeff[j];
	printf("%12.8f \n",weight[i][j]);
	sum += weight[i][j];
	}
printf("\n");
}
printf("Sum=%f\n",sum);
full_count = 0;
norm_count1 = norm_count2 = 0;
no_count = 0;
eigen_count = 0;
no_swaps = 0;
for(i=0;i<PIC_X;i++)
for(j=0;j<PIC_Y;j++)
	{
	full_vels[i][j][0] = full_vels[i][j][1] = NO_VALUE;
	norm_vels1[i][j][0] = norm_vels1[i][j][1] = NO_VALUE;
	norm_vels2[i][j][0] = norm_vels2[i][j][1] = NO_VALUE;
	if(DEBUG) for(kk=0;kk<8;kk++) data[kk][i][j] = 0.0;
	Imag[i][j] = E[i][j] = 0.0;
	}

for(i=n;i<pic_x-n;i++)
for(j=n;j<pic_y-n;j++)
	{
	M[0][0] = M[1][1] = M[0][1] = M[1][0] = 0.0;
	B[0] = B[1] = 0.0;
	mag = 1.0;
	/* Compute on 5*5 neighbourhood */
	for(k=(-2);k<=2;k++)
	for(l=(-2);l<=2;l++)
		{
		if(flag==TRUE) mag = sigma1*(Ix[i+k][j+l]*Ix[i+k][j+l]+
		                             Iy[i+k][j+l]*Iy[i+k][j+l])+sigma2;
		M[0][0] = M[0][0] + weight[k+2][l+2]*(Ix[i+k][j+l]*Ix[i+k][j+l])/mag;
		M[1][1] = M[1][1] + weight[k+2][l+2]*(Iy[i+k][j+l]*Iy[i+k][j+l])/mag;
		M[0][1] = M[0][1] + weight[k+2][l+2]*(Ix[i+k][j+l]*Iy[i+k][j+l])/mag;
		B[0] = B[0] + weight[k+2][l+2]*(Ix[i+k][j+l]*It[i+k][j+l])/mag;
		B[1] = B[1] + weight[k+2][l+2]*(Iy[i+k][j+l]*It[i+k][j+l])/mag;
		}
	if(DEBUG)
	{
	data[0][i][j] = M[0][0];
	data[1][i][j] = M[0][1];
	data[2][i][j] = M[1][1];
	data[3][i][j] = B[0];
	data[4][i][j] = B[1];
	data[5][i][j] = Ix[i][j];
	data[6][i][j] = Iy[i][j];
	data[7][i][j] = It[i][j];
	}
	M[1][0] = M[0][1]; /* The M array is symmetric */
	if(flag==TRUE)
		{
		M[0][0] = M[0][0] + 1.0f/sigmap;
		M[1][1] = M[1][1] + 1.0f/sigmap;
		}
	/* Invert 2*2 matrix */
	denominator = M[0][0]*M[1][1]-M[1][0]*M[0][1]; /* The determinant of M */
	MI[0][0] = M[1][1]/denominator;
	MI[0][1] = -M[0][1]/denominator;
	MI[1][0] = -M[1][0]/denominator;
	MI[1][1] = M[0][0]/denominator;

	jacobi(M,2,eigenvalues,eigenvectors,&nrot);
	if(check_eigen_calc(M,eigenvalues,eigenvectors,nrot,diff1,diff2,
		&length1,&length2,&angle)==FALSE)
		{
		if(FALSE)
		{
		printf("\n********************************************\n");
		printf("Fatal error: eigenvalue/eigenvector error\n");
		printf("i=%d j=%d\n",i,j);
		printf("eigenvalues: %f %f\n",eigenvalues[0],eigenvalues[1]);
		printf("eigenvector1: %f %f\n",eigenvectors[0][0],eigenvectors[1][0]);
		printf("eigenvector2: %f %f\n",eigenvectors[0][1],eigenvectors[1][1]);
		printf("\n      M:                        MI\n");
		printf("%12.6f %12.6f %12.6f %12.6f\n",M[0][0],M[0][1],MI[0][0],MI[0][1]);
		printf("%12.6f %12.6f %12.6f %12.6f\n",M[1][0],M[1][1],MI[1][0],MI[1][1]);
		printf("B: %f %f\n",B[0],B[1]);
		printf("Determinant of M: %f\n",denominator);
		printf("nrot: %d\n",nrot);
		printf("Angle between two eigenvectors: %f degrees\n",angle);
		printf("Difference length for eigenvector1\n");
		printf("Difference: %f %f Length: %f\n",diff1[0],diff1[1],length1);
		printf("Difference length for eigenvector2\n");
		printf("Difference: %f %f Length: %f\n",diff2[0],diff2[1],length2);
		/* Check eigenvalues/eigenvectors for 2*2 matrix using
		   closed form method as in Anandan's thesis */
		eigenvalues2[0] = 0.5*((M[0][0]+M[1][1]) -
		  sqrt((M[0][0]-M[1][1])*(M[0][0]-M[1][1])+4.0*M[0][1]*M[1][0]));
		eigenvalues2[1] = 0.5*((M[0][0]+M[1][1]) +
		  sqrt((M[0][0]-M[1][1])*(M[0][0]-M[1][1])+4.0*M[0][1]*M[1][0]));
		angle = (float) atan2(eigenvalues2[0]-M[0][0],M[0][1]);
		eigenvectors2[0][0] = (float) -cos(angle);
		eigenvectors2[1][0] = (float) -sin(angle);
		eigenvectors2[0][1] = (float) -sin(angle);
		eigenvectors2[1][1] = (float) cos(angle);
		printf("\nUsing Anandan's calculation:\n");
		printf("Angle of rotation: %f degrees\n",angle*180/HALF_C);
		printf("eigenvalues: %f %f\n",eigenvalues2[0],eigenvalues2[1]);
		printf("eigenvector1: %f %f\n",eigenvectors2[0][0],eigenvectors2[1][0]);
		printf("eigenvector2: %f %f\n",eigenvectors2[0][1],eigenvectors2[1][1]);
		check_eigen_calc(M,eigenvalues2,eigenvectors2,nrot,diff1,diff2,
				 &length1,&length2,&angle);
		printf("Angle between two eigenvectors: %f degrees\n",angle);
		printf("Difference length for eigenvector1\n");
		printf("Difference: %f %f Length: %f\n",diff1[0],diff1[1],length1);
		printf("Difference length for eigenvector2\n");
		printf("Difference: %f %f Length: %f\n",diff2[0],diff2[1],length2);
		printf("********************************************\n\n");
		fflush(stdout);
		if(FALSE) exit(1);
		}
		eigen_count++;
		}
	else
	{
	/* Sort the eigenvalues and the corresponding eigenvectors */
	/* Most likely, already ordered				   */
	if(eigenvalues[0] < eigenvalues[1]) /* Largest eigenvalue first */
		{
		/* swap eigenvalues */
		temp = eigenvalues[0];
		eigenvalues[0] = eigenvalues[1];
		eigenvalues[1] = temp;
		/* swap eigenvector components */
		temp = eigenvectors[0][0];
		eigenvectors[0][0] = eigenvectors[0][1];
		eigenvectors[0][1] = temp;
		temp = eigenvectors[1][0];
		eigenvectors[1][0] = eigenvectors[1][1];
		eigenvectors[1][1] = temp;
		no_swaps++;
		}

	/* Full velocity if spread of M is small */
	if(eigenvalues[0] >= tau_D && eigenvalues[1] >= tau_D)
	{
	if(denominator > 0.0)
		{
		full_vels[i][j][1] = -(v1= -(MI[0][0]*B[0]+MI[0][1]*B[1]));
		full_vels[i][j][0] =  (v2= -(MI[1][0]*B[0]+MI[1][1]*B[1]));
		/* Compute the residual */
		for(k=(-2);k<=2;k++)
		for(l=(-2);l<=2;l++)
			{
			temp1 = weight[k+2][l+2]*
			      (Ix[i+k][j+l]*v1+
			       Iy[i+k][j+l]*v2+It[i+k][j+l]);
			/* temp2 = weight[k+2][l+2]*It[i+k][j+l]; */
			E[i][j] += (temp1*temp1);
			}
		full_count++;
		}
	else { full_vels[i][j][0] = full_vels[i][j][1] = NO_VALUE; }
	}
	/* Normal velocity if spread of M is small in one direction only */
	else if(eigenvalues[0] > tau_D && fabs(denominator) > 0.00000001)
	/* Normal velocity if spread of MI is small in one direction only */
		{
		/* Project v onto that direction */
		v[0] = -(MI[0][0]*B[0]+MI[0][1]*B[1]);
		v[1] = -(MI[1][0]*B[0]+MI[1][1]*B[1]);
		norm_vels1[i][j][1] = -(v[0]*eigenvectors[0][0]+
				      v[1]*eigenvectors[1][0])*eigenvectors[0][0];
		norm_vels1[i][j][0] = (v[0]*eigenvectors[0][0]+
				      v[1]*eigenvectors[1][0])*eigenvectors[1][0];
		norm_count1++;
		/* if(i >= 50 && i <= 60 && j >= 50 && j <= 60)
		printf("Normal velocity at i:%d j:%d: %f %f\n",i,j,norm_vels1[i][j][0],norm_vels1[i][j][1]); */
		}
	else
		{
		/* printf("No velocity\n"); */
		no_count++;
		}
	}

	/* Compute type 2 normal velocity */
	mag = (Ix[i][j]*Ix[i][j] + Iy[i][j]*Iy[i][j]);
	Imag[i][j] = (float) sqrt(mag);
	if(Imag[i][j] > MAX_RAW_MAG) MAX_RAW_MAG = Imag[i][j];
	if(Imag[i][j] > RAW_MAG)
	{
	norm_vels2[i][j][1] =  It[i][j]*Ix[i][j]/mag;
	norm_vels2[i][j][0] = -It[i][j]*Iy[i][j]/mag;
	norm_count2++;
	}
	else mag_zero++;
	}

printf("%d full velocities computed\n",full_count);
printf("%d least squares normal velocities computed\n",norm_count1);
printf("%d raw normal velocities computed\n",norm_count2);
printf("%d locations where velocity information thresholded\n",no_count);
printf("%d locations where eigenvalue/eigenvector calculation failed\n",eigen_count);
printf("%d locations with spatial gradient is zero\n",mag_zero);
fflush(stdout);
if(DEBUG) for(kk=0;kk<8;kk++) fwrite(&data[kk][0][0], sizeof(float), 150*150, fd_temp[kk]);
}